

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::Reshape::backward_impl
          (Reshape *this,vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  long in_RDX;
  uint in_stack_0000008c;
  Tensor *in_stack_00000090;
  Tensor *in_stack_00000098;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_stack_000000a0;
  Device_CPU *in_stack_000000a8;
  Reshape *in_stack_000000b0;
  Tensor *in_stack_000000c0;
  
  if (*(long *)(in_RDX + 0x48) == 0) {
    __assert_fail("fx.device",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x613,
                  "virtual void dynet::Reshape::backward_impl(const std::vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if (*(int *)(*(long *)(in_RDX + 0x48) + 0xc) == 0) {
    backward_dev_impl<dynet::Device_CPU>
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
               in_stack_00000090,in_stack_0000008c,in_stack_000000c0);
    return;
  }
  abort();
}

Assistant:

void RestrictedLogSoftmax::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef __CUDACC__
  throw std::runtime_error("RestrictedLogSoftmax not yet implemented for CUDA");
#else
  // TODO create auxiliary mask with -infty's
  // and do usual LogSoftmax stuff
  assert(xs.size() == 1);
  assert(denom.size() > 0);
  auto x = **xs[0];
  assert(x.cols() == 1);
  const real logz = logsumexp(x, denom);
  TensorTools::Constant(fx, -numeric_limits<real>::infinity());
  for (auto i : denom)
    (*fx)(i,0) = x(i,0) - logz;
  if (denom.size() == 1) (*fx)(denom.front(), 0) = 0;
#endif
}